

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall testing::internal::MatchMatrix::Randomize(MatchMatrix *this)

{
  int iVar1;
  size_t sVar2;
  byte *pbVar3;
  MatchMatrix *in_RDI;
  char *b;
  size_t irhs;
  size_t ilhs;
  ulong local_18;
  ulong local_10;
  
  local_10 = 0;
  while( true ) {
    sVar2 = LhsSize(in_RDI);
    if (sVar2 <= local_10) break;
    local_18 = 0;
    while( true ) {
      sVar2 = RhsSize(in_RDI);
      if (sVar2 <= local_18) break;
      sVar2 = SpaceIndex(in_RDI,local_10,local_18);
      pbVar3 = (byte *)std::vector<char,_std::allocator<char>_>::operator[]
                                 ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x10),sVar2);
      iVar1 = rand();
      *pbVar3 = (byte)iVar1 & 1;
      local_18 = local_18 + 1;
    }
    local_10 = local_10 + 1;
  }
  return;
}

Assistant:

void MatchMatrix::Randomize() {
  for (size_t ilhs = 0; ilhs < LhsSize(); ++ilhs) {
    for (size_t irhs = 0; irhs < RhsSize(); ++irhs) {
      char& b = matched_[SpaceIndex(ilhs, irhs)];
      b = static_cast<char>(rand() & 1);  // NOLINT
    }
  }
}